

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

string * __thiscall
args::FlagBase::GetNameString_abi_cxx11_
          (string *__return_storage_ptr__,FlagBase *this,HelpParams *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  size_type *psVar6;
  long extraout_RDX;
  pointer this_00;
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> flagStrings;
  string postfix;
  string local_b8;
  vector<args::EitherFlag,_std::allocator<args::EitherFlag>_> local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (params->showValueName == true) {
    iVar3 = (*(this->super_NamedBase).super_Base._vptr_Base[0x13])(this);
    if (extraout_RDX != 0 || CONCAT44(extraout_var,iVar3) != 0) {
      (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(&local_70,this);
      goto LAB_0010c8ff;
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
LAB_0010c8ff:
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Matcher::GetFlagStrings(&local_98,&this->matcher);
  lVar5 = (long)local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
      super__Vector_impl_data._M_start) {
    bVar2 = params->useValueNameOnce;
    paVar1 = &local_b8.field_2;
    local_78 = &params->valueOpen;
    this_00 = local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (this_00 !=
          local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,
                 *(ulong *)((long)&(params->shortPrefix)._M_dataplus._M_p +
                           (ulong)((this_00->isShort ^ 1) << 5)));
      EitherFlag::str_abi_cxx11_(&local_b8,this_00);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
      if ((local_70._M_string_length != 0) &&
         ((lVar5 != 0x28 & bVar2 &
          this_00 + 1 !=
          local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>._M_impl.
          super__Vector_impl_data._M_finish) == 0)) {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,
                   *(ulong *)((long)&(params->shortSeparator)._M_dataplus._M_p +
                             (ulong)((this_00->isShort ^ 1) << 5)));
        std::operator+(&local_50,local_78,&local_70);
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,(ulong)(params->valueClose)._M_dataplus._M_p);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_b8.field_2._M_allocated_capacity = *psVar6;
          local_b8.field_2._8_8_ = plVar4[3];
          local_b8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar6;
          local_b8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             local_98.super__Vector_base<args::EitherFlag,_std::allocator<args::EitherFlag>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<args::EitherFlag,_std::allocator<args::EitherFlag>_>::~vector(&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetNameString(const HelpParams &params) const override
            {
                const std::string postfix = !params.showValueName || NumberOfArguments() == 0 ? std::string() : Name();
                std::string flags;
                const auto flagStrings = matcher.GetFlagStrings();
                const bool useValueNameOnce = flagStrings.size() == 1 ? false : params.useValueNameOnce;
                for (auto it = flagStrings.begin(); it != flagStrings.end(); ++it)
                {
                    auto &flag = *it;
                    if (it != flagStrings.begin())
                    {
                        flags += ", ";
                    }

                    flags += flag.isShort ? params.shortPrefix : params.longPrefix;
                    flags += flag.str();

                    if (!postfix.empty() && (!useValueNameOnce || it + 1 == flagStrings.end()))
                    {
                        flags += flag.isShort ? params.shortSeparator : params.longSeparator;
                        flags += params.valueOpen + postfix + params.valueClose;
                    }
                }

                return flags;
            }